

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O2

void __thiscall
QTextOdfWriter::writeInlineCharacter
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextFragment *fragment)

{
  ulong uVar1;
  qreal qVar2;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  char16_t *pcVar5;
  Data *pDVar6;
  qsizetype qVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  storage_type *psVar11;
  QByteArray *pQVar12;
  char16_t *pcVar13;
  QUrl *this_00;
  void *__buf;
  void *__buf_00;
  size_t in_R9;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar14;
  long in_FS_OFFSET;
  undefined4 uVar15;
  undefined4 uVar16;
  QLatin1StringView s;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QByteArrayView QVar24;
  QAnyStringView QVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QAnyStringView QVar30;
  QByteArrayView QVar31;
  QAnyStringView QVar32;
  QByteArrayView QVar33;
  QAnyStringView QVar34;
  QAnyStringView QVar35;
  QAnyStringView QVar36;
  QAnyStringView QVar37;
  QAnyStringView QVar38;
  QAnyStringView QVar39;
  QArrayDataPointer<char16_t> local_1c8;
  QImageWriter imageWriter;
  QArrayDataPointer<char16_t> local_178;
  char16_t *local_158;
  ulong uStack_150;
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_128;
  QUrl url;
  QArrayDataPointer<char16_t> local_108;
  undefined1 local_e8 [16];
  QImageData *local_d8;
  qreal local_c8;
  qreal width;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  char16_t *local_78;
  ulong uStack_70;
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar13 = (this->drawNS).d.ptr;
  uVar1 = (this->drawNS).d.size;
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("frame",6);
  QVar24.m_data = psVar11;
  QVar24.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar24);
  QVar17.m_size = local_58._8_8_;
  QVar17.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar25.m_size = (size_t)pcVar13;
  QVar25.field_0.m_data_utf8 = (char *)writer;
  QXmlStreamWriter::writeStartElement(QVar25,QVar17);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (this->m_strategy == (QOutputStrategy *)0x0) goto LAB_00521f6d;
  QTextFragment::charFormat((QTextFragment *)&local_58);
  bVar8 = QTextFormat::isImageFormat((QTextFormat *)&local_58);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if (!bVar8) goto LAB_00521f6d;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFragment::charFormat((QTextFragment *)&local_58);
  QTextFormat::toImageFormat((QTextFormat *)local_68);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  pcVar13 = (this->drawNS).d.ptr;
  uVar1 = (this->drawNS).d.size;
  psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("name",5);
  QVar26.m_data = psVar11;
  QVar26.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar26);
  QTextImageFormat::name((QString *)&local_98,(QTextImageFormat *)local_68);
  local_78 = local_98.ptr;
  uStack_70 = local_98.size | 0x8000000000000000;
  QVar18.m_size = local_58._8_8_;
  QVar18.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar27.m_size = (size_t)pcVar13;
  QVar27.field_0.m_data_utf8 = (char *)writer;
  QVar35.m_size = in_R9;
  QVar35.field_0.m_data = (void *)(local_58._16_8_ | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar27,QVar18,QVar35);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  local_98.size = 0;
  local_b8.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  width = 0.0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (char16_t *)0x0;
  local_c8 = 0.0;
  local_d8 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_e8);
  local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTextImageFormat::name((QString *)&local_108,(QTextImageFormat *)local_68);
  cVar9 = QString::startsWith((QLatin1String *)&local_108,2);
  if (cVar9 != '\0') {
    s.m_data = "qrc";
    s.m_size = 3;
    QString::prepend((QString *)&local_108,s);
  }
  this_00 = &url;
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(this_00,(QString *)&local_108,TolerantMode);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::resource((QVariant *)&local_58,this->m_document,2,this_00);
  iVar10 = ::QVariant::typeId((QVariant *)&local_58);
  if (iVar10 == 0x1001) {
LAB_00521829:
    qvariant_cast<QImage>((QImage *)&local_128,(QVariant *)&local_58);
    QImage::operator=((QImage *)local_e8,(QImage *)&local_128);
    QImage::~QImage((QImage *)&local_128);
  }
  else {
    iVar10 = ::QVariant::typeId((QVariant *)&local_58);
    if (iVar10 == 0x1006) goto LAB_00521829;
    iVar10 = ::QVariant::typeId((QVariant *)&local_58);
    if (iVar10 == 0xc) {
      ::QVariant::toByteArray();
      qVar7 = local_98.size;
      pcVar13 = local_98.ptr;
      pDVar6 = local_98.d;
      local_98.d = local_128.d;
      local_98.ptr = local_128.ptr;
      local_128.d = pDVar6;
      local_128.ptr = pcVar13;
      local_98.size = local_128.size;
      local_128.size = qVar7;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
      local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QBuffer::QBuffer((QBuffer *)&local_128,(QByteArray *)&local_98,(QObject *)0x0);
      QBuffer::open(&local_128,1);
      this_00 = (QUrl *)&width;
      probeImageData((QIODevice *)&local_128,(QImage *)local_e8,(QString *)&local_b8,
                     (qreal *)this_00,&local_c8);
      QBuffer::~QBuffer((QBuffer *)&local_128);
    }
    else {
      local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_148.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextImageFormat::name((QString *)&local_128,(QTextImageFormat *)local_68);
      QFile::QFile((QFile *)&local_148,(QString *)&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      cVar9 = QFile::open(&local_148);
      if (cVar9 != '\0') {
        this_00 = (QUrl *)&width;
        bVar8 = probeImageData((QIODevice *)&local_148,(QImage *)local_e8,(QString *)&local_b8,
                               (qreal *)this_00,&local_c8);
        if (!bVar8) {
          QFileDevice::seek((longlong)&local_148);
          QIODevice::readAll();
          qVar7 = local_98.size;
          pcVar13 = local_98.ptr;
          pDVar6 = local_98.d;
          this_00 = (QUrl *)local_128.size;
          local_98.d = local_128.d;
          local_98.ptr = local_128.ptr;
          local_128.d = pDVar6;
          local_128.ptr = pcVar13;
          local_98.size = local_128.size;
          local_128.size = qVar7;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
        }
      }
      QFile::~QFile((QFile *)&local_148);
    }
  }
  bVar8 = QImage::isNull((QImage *)local_e8);
  if (!bVar8) {
    local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_178.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QBuffer::QBuffer((QBuffer *)&local_178,(QObject *)0x0);
    iVar10 = QTextImageFormat::quality((QTextImageFormat *)local_68);
    if (iVar10 - 100U < 0xffffff9d) {
LAB_005218ba:
      imageWriter.d = (QImageWriterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)&local_128,"png",-1);
      QImageWriter::QImageWriter(&imageWriter,(QIODevice *)&local_178,(QByteArray *)&local_128);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
      QImageWriter::write(&imageWriter,(int)local_e8,__buf,(size_t)this_00);
      pQVar12 = (QByteArray *)QBuffer::data();
      QByteArray::operator=((QByteArray *)&local_98,pQVar12);
      pcVar13 = L"image/png";
      uVar15 = local_b8.d._0_4_;
      uVar16 = local_b8.d._4_4_;
    }
    else {
      bVar8 = QImage::hasAlphaChannel((QImage *)local_e8);
      if (bVar8) goto LAB_005218ba;
      imageWriter.d = (QImageWriterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)&local_128,"jpg",-1);
      QImageWriter::QImageWriter(&imageWriter,(QIODevice *)&local_178,(QByteArray *)&local_128);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
      QImageWriter::setQuality(&imageWriter,iVar10);
      QImageWriter::write(&imageWriter,(int)local_e8,__buf_00,(size_t)this_00);
      pQVar12 = (QByteArray *)QBuffer::data();
      QByteArray::operator=((QByteArray *)&local_98,pQVar12);
      pcVar13 = L"image/jpg";
      uVar15 = local_b8.d._0_4_;
      uVar16 = local_b8.d._4_4_;
    }
    local_128.size = local_b8.size;
    local_b8.d = (Data *)0x0;
    local_148.size = 0;
    local_148.ptr = (char16_t *)0x0;
    local_148.d = (Data *)0x0;
    local_128.d = (Data *)CONCAT44(uVar16,uVar15);
    local_128.ptr = (char16_t *)CONCAT44(local_b8.ptr._4_4_,local_b8.ptr._0_4_);
    local_b8.size = (qsizetype)&DAT_00000009;
    local_b8.ptr = pcVar13;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    QImageWriter::~QImageWriter(&imageWriter);
    iVar10 = QImage::width((QImage *)local_e8);
    width = (qreal)iVar10;
    iVar10 = QImage::height((QImage *)local_e8);
    local_c8 = (qreal)iVar10;
    QBuffer::~QBuffer((QBuffer *)&local_178);
  }
  if ((QUrl *)local_98.size != (QUrl *)0x0) {
    bVar8 = QTextFormat::hasProperty((QTextFormat *)local_68,0x5010);
    if (bVar8) {
      width = QTextImageFormat::width((QTextImageFormat *)local_68);
    }
    bVar8 = QTextFormat::hasProperty((QTextFormat *)local_68,0x5011);
    if (bVar8) {
      qVar2 = QTextImageFormat::height((QTextImageFormat *)local_68);
      uVar15 = SUB84(qVar2,0);
      uVar16 = (undefined4)((ulong)qVar2 >> 0x20);
    }
    else {
      uVar15 = SUB84(local_c8,0);
      uVar16 = (undefined4)((ulong)local_c8 >> 0x20);
    }
    local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_128.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QOutputStrategy::createUniqueImageName((QString *)&local_128,this->m_strategy);
    (*this->m_strategy->_vptr_QOutputStrategy[2])(this->m_strategy,&local_128,&local_b8,&local_98);
    pcVar13 = (this->svgNS).d.ptr;
    uVar1 = (this->svgNS).d.size;
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("width",6);
    QVar28.m_data = psVar11;
    QVar28.m_size = (qsizetype)&local_148;
    QString::fromLatin1(QVar28);
    pcVar5 = local_148.ptr;
    aVar14.m_data = (void *)(local_148.size | 0x8000000000000000);
    pixelToPoint((QString *)&local_178,width);
    local_158 = local_178.ptr;
    uStack_150 = local_178.size | 0x8000000000000000;
    QVar3.m_size = (size_t)pcVar13;
    QVar3.field_0.m_data_utf8 = (char *)writer;
    QVar19.m_size = (size_t)pcVar5;
    QVar19.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
    QVar36.m_size = in_R9;
    QVar36.field_0.m_data = aVar14.m_data;
    QXmlStreamWriter::writeAttribute(QVar3,QVar19,QVar36);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    pcVar13 = (this->svgNS).d.ptr;
    uVar1 = (this->svgNS).d.size;
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("height",7);
    QVar29.m_data = psVar11;
    QVar29.m_size = (qsizetype)&local_148;
    QString::fromLatin1(QVar29);
    pcVar5 = local_148.ptr;
    aVar14.m_data = (void *)(local_148.size | 0x8000000000000000);
    pixelToPoint((QString *)&local_178,(qreal)CONCAT44(uVar16,uVar15));
    QVar4.m_size = (size_t)pcVar13;
    QVar4.field_0.m_data_utf8 = (char *)writer;
    QVar20.m_size = (size_t)pcVar5;
    QVar20.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
    QVar37.m_size = in_R9;
    QVar37.field_0.m_data = aVar14.m_data;
    QXmlStreamWriter::writeAttribute(QVar4,QVar20,QVar37);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    QVar21.field_0.m_data = (void *)((this->textNS).d.size | 0x8000000000000000);
    local_148.d = (Data *)0x0;
    local_178.d = (Data *)0x0;
    local_178.ptr = (char16_t *)0x0;
    local_148.ptr = L"anchor-type";
    local_178.size = 0;
    local_148.size = 0xb;
    imageWriter.d = (QImageWriterPrivate *)0x0;
    local_1c8.d = (Data *)0x0;
    local_1c8.ptr = (char16_t *)0x0;
    local_1c8.size = 0;
    QVar21.m_size = (size_t)L"anchor-type";
    QVar30.m_size = (size_t)(this->textNS).d.ptr;
    QVar30.field_0.m_data_utf8 = (char *)writer;
    QVar38.m_size = in_R9;
    QVar38.field_0.m_data = (void *)0x800000000000000b;
    QXmlStreamWriter::writeAttribute(QVar30,QVar21,QVar38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&imageWriter);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
    pcVar13 = (this->drawNS).d.ptr;
    uVar1 = (this->drawNS).d.size;
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("image",6);
    QVar31.m_data = psVar11;
    QVar31.m_size = (qsizetype)&local_148;
    QString::fromLatin1(QVar31);
    QVar22.m_size = (size_t)local_148.ptr;
    QVar22.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
    QVar32.m_size = (size_t)pcVar13;
    QVar32.field_0.m_data_utf8 = (char *)writer;
    QXmlStreamWriter::writeStartElement(QVar32,QVar22);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    pcVar13 = (this->xlinkNS).d.ptr;
    uVar1 = (this->xlinkNS).d.size;
    psVar11 = (storage_type *)QByteArrayView::lengthHelperCharArray("href",5);
    QVar33.m_data = psVar11;
    QVar33.m_size = (qsizetype)&local_148;
    QString::fromLatin1(QVar33);
    QVar39.field_0.m_data = (void *)(local_148.size | 0x8000000000000000);
    QVar23.m_size = (size_t)local_148.ptr;
    QVar23.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
    QVar34.m_size = (size_t)pcVar13;
    QVar34.field_0.m_data_utf8 = (char *)writer;
    QVar39.m_size = in_R9;
    QXmlStreamWriter::writeAttribute(QVar34,QVar23,QVar39);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    QXmlStreamWriter::writeEndElement();
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  QUrl::~QUrl(&url);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  QImage::~QImage((QImage *)local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
LAB_00521f6d:
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::writeInlineCharacter(QXmlStreamWriter &writer, const QTextFragment &fragment) const
{
    writer.writeStartElement(drawNS, QString::fromLatin1("frame"));
    if (m_strategy == nullptr) {
        // don't do anything.
    }
    else if (fragment.charFormat().isImageFormat()) {
        QTextImageFormat imageFormat = fragment.charFormat().toImageFormat();
        writer.writeAttribute(drawNS, QString::fromLatin1("name"), imageFormat.name());

        QByteArray data;
        QString mimeType;
        qreal width = 0;
        qreal height = 0;

        QImage image;
        QString name = imageFormat.name();
        if (name.startsWith(":/"_L1)) // auto-detect resources
            name.prepend("qrc"_L1);
        QUrl url = QUrl(name);
        const QVariant variant = m_document->resource(QTextDocument::ImageResource, url);
        if (variant.userType() == QMetaType::QPixmap || variant.userType() == QMetaType::QImage) {
            image = qvariant_cast<QImage>(variant);
        } else if (variant.userType() == QMetaType::QByteArray) {
            data = variant.toByteArray();

            QBuffer buffer(&data);
            buffer.open(QIODevice::ReadOnly);
            probeImageData(&buffer, &image, &mimeType, &width, &height);
        } else {
            // try direct loading
            QFile file(imageFormat.name());
            if (file.open(QIODevice::ReadOnly) && !probeImageData(&file, &image, &mimeType, &width, &height)) {
                file.seek(0);
                data = file.readAll();
            }
        }

        if (! image.isNull()) {
            QBuffer imageBytes;

            int imgQuality = imageFormat.quality();
            if (imgQuality >= 100 || imgQuality <= 0 || image.hasAlphaChannel()) {
                QImageWriter imageWriter(&imageBytes, "png");
                imageWriter.write(image);

                data = imageBytes.data();
                mimeType = QStringLiteral("image/png");
            } else {
                // Write images without alpha channel as jpg with quality set by QTextImageFormat
                QImageWriter imageWriter(&imageBytes, "jpg");
                imageWriter.setQuality(imgQuality);
                imageWriter.write(image);

                data = imageBytes.data();
                mimeType = QStringLiteral("image/jpg");
            }

            width = image.width();
            height = image.height();
        }

        if (!data.isEmpty()) {
            if (imageFormat.hasProperty(QTextFormat::ImageWidth)) {
                width = imageFormat.width();
            }
            if (imageFormat.hasProperty(QTextFormat::ImageHeight)) {
                height = imageFormat.height();
            }

            QString filename = m_strategy->createUniqueImageName();

            m_strategy->addFile(filename, mimeType, data);

            writer.writeAttribute(svgNS, QString::fromLatin1("width"), pixelToPoint(width));
            writer.writeAttribute(svgNS, QString::fromLatin1("height"), pixelToPoint(height));
            writer.writeAttribute(textNS, QStringLiteral("anchor-type"), QStringLiteral("as-char"));
            writer.writeStartElement(drawNS, QString::fromLatin1("image"));
            writer.writeAttribute(xlinkNS, QString::fromLatin1("href"), filename);
            writer.writeEndElement(); // image
        }
    }
    writer.writeEndElement(); // frame
}